

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void __thiscall MppThread::stop(MppThread *this)

{
  MppThreadStatus MVar1;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  void *local_18;
  void *dummy;
  MppThread *this_local;
  
  dummy = this;
  MVar1 = get_status(this,THREAD_WORK);
  if (MVar1 != MPP_THREAD_UNINITED) {
    lock(this,THREAD_WORK);
    set_status(this,MPP_THREAD_STOPPING,THREAD_WORK);
    __handler = extraout_RDX;
    if ((thread_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_thread","MPP_THREAD_STOPPING status set mThread %p",(char *)0x0,this);
      __handler = extraout_RDX_00;
    }
    signal(this,0,__handler);
    unlock(this,THREAD_WORK);
    pthread_join(this->mThread,&local_18);
    if ((thread_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_thread","thread %s %p context %p destroy success\n",(char *)0x0,this->mName,
                 this->mFunction,this->mContext);
    }
    set_status(this,MPP_THREAD_UNINITED,THREAD_WORK);
  }
  return;
}

Assistant:

void MppThread::stop()
{
    if (MPP_THREAD_UNINITED != get_status()) {
        lock();
        set_status(MPP_THREAD_STOPPING);
        thread_dbg(MPP_THREAD_DBG_FUNCTION,
                   "MPP_THREAD_STOPPING status set mThread %p", this);
        signal();
        unlock();
        void *dummy;
        pthread_join(mThread, &dummy);
        thread_dbg(MPP_THREAD_DBG_FUNCTION,
                   "thread %s %p context %p destroy success\n",
                   mName, mFunction, mContext);

        set_status(MPP_THREAD_UNINITED);
    }
}